

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

double pythag(double a,double b)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar1 = ABS(a);
  dVar3 = ABS(b);
  if (dVar1 <= dVar3) {
    dVar2 = 0.0;
    if ((b != 0.0) || (NAN(b))) {
      dVar2 = SQRT((dVar1 / dVar3) * (dVar1 / dVar3) + 1.0) * dVar3;
    }
  }
  else {
    dVar2 = SQRT((dVar3 / dVar1) * (dVar3 / dVar1) + 1.0) * dVar1;
  }
  return dVar2;
}

Assistant:

static double pythag(double a, double b) {
	double absa, absb,val;
	absa = (double) fabs(a);
	absb = (double) fabs(b);

	if (absa > absb) {
		val = (double) absa*sqrt(1.0 + (absb / absa)*(absb / absa));
		return val;
	}
	else {
		val = (double) (absb == 0.0 ? 0.0 : absb*sqrt(1.0 + (absa / absb)*(absa / absb)));
		return val;
	}
}